

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6cbd3::CustomAPNGAsmListener::onPostAddFrame
          (CustomAPNGAsmListener *this,APNGFrame *frame)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"New Frame => Delay=(",0x14);
  apngasm::APNGFrame::delayNum((uint)frame);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
  apngasm::APNGFrame::delayDen((uint)frame);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") sec",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void onPostAddFrame(const apngasm::APNGFrame &frame) const {
    apngasm::APNGFrame &tmp = const_cast<apngasm::APNGFrame &>(frame);
    std::cout << "New Frame => Delay=(" << tmp.delayNum() << "/"
              << tmp.delayDen() << ") sec" << std::endl;
  }